

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.h
# Opt level: O1

Array * __thiscall FlatZinc::ParserState::getOutput(ParserState *this)

{
  pointer *pppNVar1;
  pointer ppVar2;
  pointer pcVar3;
  iterator iVar4;
  Node **ppNVar5;
  Array *pAVar6;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *this_00;
  Node *pNVar7;
  long lVar8;
  ulong uVar9;
  Node **j;
  Node **__args;
  pointer ppVar10;
  Node *local_80;
  _func_int **local_78;
  _func_int **local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  _func_int **pp_Stack_60;
  _func_int **local_58;
  _func_int **local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  _func_int **pp_Stack_40;
  pointer local_38;
  
  ppVar10 = (this->_output).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->_output).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar10 != ppVar2) {
    uVar9 = ((long)ppVar2 - (long)ppVar10 >> 3) * -0x3333333333333333;
    lVar8 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>*,std::vector<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>,std::allocator<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar10,ppVar2,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>*,std::vector<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>,std::allocator<std::pair<std::__cxx11::string,FlatZinc::AST::Node*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar10,ppVar2);
  }
  pAVar6 = (Array *)operator_new(0x20);
  (pAVar6->super_Node)._vptr_Node = (_func_int **)&PTR__Array_0020f318;
  (pAVar6->a).super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar6->a).super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar6->a).super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar10 = (this->_output).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->_output).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar10 != local_38) {
    this_00 = &pAVar6->a;
    do {
      pNVar7 = (Node *)operator_new(0x28);
      pcVar3 = (ppVar10->first)._M_dataplus._M_p;
      local_78 = (_func_int **)&local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (ppVar10->first)._M_string_length);
      std::__cxx11::string::append((char *)&local_78);
      pNVar7->_vptr_Node = (_func_int **)&PTR__String_0020f340;
      pNVar7[1]._vptr_Node = (_func_int **)(pNVar7 + 3);
      if (local_78 == (_func_int **)&local_68) {
        pNVar7[3]._vptr_Node = (_func_int **)CONCAT71(uStack_67,local_68);
        pNVar7[4]._vptr_Node = pp_Stack_60;
      }
      else {
        pNVar7[1]._vptr_Node = local_78;
        pNVar7[3]._vptr_Node = (_func_int **)CONCAT71(uStack_67,local_68);
      }
      pNVar7[2]._vptr_Node = local_70;
      local_70 = (_func_int **)0x0;
      local_68 = 0;
      iVar4._M_current =
           (pAVar6->a).
           super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_80 = pNVar7;
      if (iVar4._M_current ==
          (pAVar6->a).
          super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_78 = (_func_int **)&local_68;
        std::vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>>::
        _M_realloc_insert<FlatZinc::AST::Node*>
                  ((vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>> *)this_00,
                   iVar4,&local_80);
      }
      else {
        *iVar4._M_current = pNVar7;
        pppNVar1 = &(pAVar6->a).
                    super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
        local_78 = (_func_int **)&local_68;
      }
      if (local_78 != (_func_int **)&local_68) {
        operator_delete(local_78);
      }
      pNVar7 = ppVar10->second;
      lVar8 = __dynamic_cast(pNVar7,&AST::Node::typeinfo,&AST::Array::typeinfo,0);
      if (lVar8 == 0) {
        iVar4._M_current =
             (pAVar6->a).
             super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pAVar6->a).
            super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>>::
          _M_realloc_insert<FlatZinc::AST::Node*const&>
                    ((vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>> *)this_00,
                     iVar4,&ppVar10->second);
        }
        else {
          *iVar4._M_current = pNVar7;
          pppNVar1 = &(pAVar6->a).
                      super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      else {
        ppNVar5 = *(Node ***)(lVar8 + 0x10);
        for (__args = *(Node ***)(lVar8 + 8); __args != ppNVar5; __args = __args + 1) {
          iVar4._M_current =
               (pAVar6->a).
               super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (pAVar6->a).
              super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>>::
            _M_realloc_insert<FlatZinc::AST::Node*const&>
                      ((vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>> *)this_00,
                       iVar4,__args);
          }
          else {
            *iVar4._M_current = *__args;
            pppNVar1 = &(pAVar6->a).
                        super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppNVar1 = *pppNVar1 + 1;
          }
          *__args = (Node *)0x0;
        }
        pNVar7 = ppVar10->second;
        if (pNVar7 != (Node *)0x0) {
          (*pNVar7->_vptr_Node[1])();
        }
      }
      pNVar7 = (Node *)operator_new(0x28);
      local_58 = (_func_int **)&local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,";\n","");
      pNVar7->_vptr_Node = (_func_int **)&PTR__String_0020f340;
      pNVar7[1]._vptr_Node = (_func_int **)(pNVar7 + 3);
      if (local_58 == (_func_int **)&local_48) {
        pNVar7[3]._vptr_Node = (_func_int **)CONCAT71(uStack_47,local_48);
        pNVar7[4]._vptr_Node = pp_Stack_40;
      }
      else {
        pNVar7[1]._vptr_Node = local_58;
        pNVar7[3]._vptr_Node = (_func_int **)CONCAT71(uStack_47,local_48);
      }
      pNVar7[2]._vptr_Node = local_50;
      local_50 = (_func_int **)0x0;
      local_48 = 0;
      iVar4._M_current =
           (pAVar6->a).
           super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_80 = pNVar7;
      if (iVar4._M_current ==
          (pAVar6->a).
          super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_58 = (_func_int **)&local_48;
        std::vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>>::
        _M_realloc_insert<FlatZinc::AST::Node*>
                  ((vector<FlatZinc::AST::Node*,std::allocator<FlatZinc::AST::Node*>> *)this_00,
                   iVar4,&local_80);
      }
      else {
        *iVar4._M_current = pNVar7;
        pppNVar1 = &(pAVar6->a).
                    super__Vector_base<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
        local_58 = (_func_int **)&local_48;
      }
      if (local_58 != (_func_int **)&local_48) {
        operator_delete(local_58);
      }
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != local_38);
  }
  return pAVar6;
}

Assistant:

AST::Array* getOutput() {
		std::sort(_output.begin(), _output.end());
		auto* a = new AST::Array();
		for (auto& i : _output) {
			a->a.push_back(new AST::String(i.first + " = "));
			if (i.second->isArray()) {
				AST::Array* oa = i.second->getArray();
				for (auto& j : oa->a) {
					a->a.push_back(j);
					j = nullptr;
				}
				delete i.second;
			} else {
				a->a.push_back(i.second);
			}
			a->a.push_back(new AST::String(";\n"));
		}
		return a;
	}